

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::resize(SmallVectorImpl<llvm::StringRef> *this,size_type N)

{
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  iterator E;
  iterator I;
  size_type N_local;
  SmallVectorImpl<llvm::StringRef> *this_local;
  
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  if (N < sVar3) {
    pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
    pvVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<llvm::StringRef,_true>::destroy_range
              ((StringRef *)((long)pvVar1 + N * 0x10),(StringRef *)((long)pvVar2 + sVar3 * 0x10));
    SmallVectorBase::set_size((SmallVectorBase *)this,N);
  }
  else {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if (sVar3 < N) {
      sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
      if (sVar3 < N) {
        SmallVectorTemplateBase<llvm::StringRef,_true>::grow
                  (&this->super_SmallVectorTemplateBase<llvm::StringRef,_true>,N);
      }
      pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      pvVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      for (E = (iterator)((long)pvVar1 + sVar3 * 0x10); E != (iterator)((long)pvVar2 + N * 0x10);
          E = E + 1) {
        memset(E,0,0x10);
        StringRef::StringRef(E);
      }
      SmallVectorBase::set_size((SmallVectorBase *)this,N);
    }
  }
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }